

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O3

void printModel(char *filename)

{
  size_t __size;
  bool bVar1;
  uint uVar2;
  bool bVar3;
  int *piVar4;
  FILE *__s;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  
  __s = fopen(filename,"w");
  if (__s != (FILE *)0x0) {
    fwrite("c Satisfiability model produced by sgen4\n",0x29,1,__s);
    fprintf(__s,"c %s\n",commandLine);
    fwrite("s SATISFIABLE\n",0xe,1,__s);
    if (0 < numOfVariables) {
      uVar8 = 1;
      lVar11 = 0;
      do {
        iVar5 = (int)(uVar8 / 0x14);
        if ((int)lVar11 == iVar5 * 0x14) {
          fwrite("v ",2,1,__s);
        }
        fprintf(__s,"%d ",(ulong)(uint)(model[lVar11 + 1] * globalPermute[lVar11 + 1]));
        if (iVar5 * -0x14 + (int)lVar11 == -1) {
          fputc(10,__s);
        }
        lVar11 = lVar11 + 1;
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (lVar11 < numOfVariables);
    }
    if ((numOfVariables * -0x33333333 + 0x19999998U >> 2 | numOfVariables * 0x40000000) < 0xccccccd)
    {
      fwrite("v ",2,1,__s);
    }
    fwrite("0 \n",3,1,__s);
    fclose(__s);
    return;
  }
  printModel_cold_1();
  initModel(numOfVariables);
  __size = (long)numOfVariables * 4 + 4;
  permute = (int *)malloc(__size);
  unpermute = (int *)malloc(__size);
  groupSize = 5;
  initGlobalPermute();
  piVar4 = permute;
  uVar8 = (ulong)(uint)numOfVariables;
  uVar7 = 1;
  bVar3 = true;
  if (0 < numOfVariables) {
    lVar11 = 1;
    do {
      piVar4[lVar11] = (int)lVar11;
      uVar8 = (ulong)numOfVariables;
      bVar1 = lVar11 < (long)uVar8;
      lVar11 = lVar11 + 1;
    } while (bVar1);
    if (0 < numOfVariables) {
      uVar7 = 1;
      iVar5 = numOfVariables;
      do {
        uVar7 = uVar7 * 2;
        iVar5 = iVar5 + -1;
        bVar3 = numOfVariables < 1;
      } while (iVar5 != 0);
    }
  }
  piVar4 = model;
  if (isSat == 0) {
    uVar10 = 0xffffffff;
    uVar6 = (ulong)uVar7;
  }
  else {
    uVar6 = (ulong)(uVar7 - 1);
    next = next * 0x41c64e6d + 0x3039;
    uVar10 = (uint)((long)(ulong)((uint)(next >> 0x10) & 0x7fff) % (long)(int)(uVar7 - 1));
    if (!bVar3) {
      uVar12 = 1;
      lVar11 = 0;
      do {
        uVar9 = uVar12 & uVar10;
        uVar12 = uVar12 * 2;
        piVar4[lVar11 + 1] = -(uint)(uVar9 != 0) | 1;
        lVar11 = lVar11 + 1;
        uVar8 = (ulong)numOfVariables;
      } while (lVar11 < (long)uVar8);
    }
  }
  printf("p cnf %d %d\n",uVar8,uVar6);
  uVar12 = 0;
  do {
    if (uVar12 != uVar10) {
      if (0 < numOfVariables) {
        uVar9 = 1;
        lVar11 = 0;
        do {
          uVar2 = -globalPermute[lVar11 + 1];
          if ((uVar9 & uVar12) != 0) {
            uVar2 = globalPermute[lVar11 + 1];
          }
          printf("%d ",(ulong)uVar2);
          uVar9 = uVar9 * 2;
          lVar11 = lVar11 + 1;
        } while (lVar11 < numOfVariables);
      }
      puts("0");
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != uVar7 + (uVar7 == 0));
  if (*stringOptions == (char *)0x0) {
    return;
  }
  printModel(*stringOptions);
  return;
}

Assistant:

void printModel (char *filename)
{
    FILE *f;
    int v, varsPerLine;

    f = fopen (filename, "w");
    if (f != NULL)
    {
        fprintf (f, "c Satisfiability model produced by sgen4\n");
        fprintf (f, "c %s\n", commandLine);
        fprintf (f, "s SATISFIABLE\n");

        varsPerLine = 20;

        for (v=1;v<=numOfVariables;v++)
        {
            if ( v % varsPerLine == 1)
                fprintf (f, "v ");
            fprintf (f, "%d ", unPermuteVar(v)*model[v]);
            if (v % varsPerLine == 0)
                fprintf (f, "\n");
        }
        if (numOfVariables % varsPerLine == 0)
            fprintf (f, "v ");
        fprintf (f, "0 \n");
        fclose (f);
    }
    else
    {
        fprintf (stderr, "Unable to write model to file <%s>\n", filename);
        exit(0);
    }

}